

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_source(AMQP_VALUE value,SOURCE_HANDLE *source_handle)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  int iVar4;
  SOURCE_HANDLE pSVar5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE pAVar7;
  uint32_t list_item_count;
  terminus_durability durable;
  AMQP_VALUE outcomes_array;
  uint local_44;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  pSVar5 = (SOURCE_HANDLE)malloc(8);
  if (pSVar5 == (SOURCE_HANDLE)0x0) {
    *source_handle = (SOURCE_HANDLE)0x0;
    iVar4 = 0x2f0f;
  }
  else {
    pSVar5->composite_value = (AMQP_VALUE)0x0;
    *source_handle = pSVar5;
    pAVar6 = amqpvalue_get_inplace_described_value(value);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      source_destroy(*source_handle);
      iVar4 = 0x2f17;
    }
    else {
      iVar2 = amqpvalue_get_list_item_count(pAVar6,&local_44);
      iVar4 = 0x2f1e;
      if (iVar2 == 0) {
        if ((local_44 != 0) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,0), pAVar7 != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy(pAVar7);
        }
        if ((1 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,1), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar4 != 0)) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2f47;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((2 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,2), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar4 != 0)) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2f64;
          }
          amqpvalue_destroy(pAVar7);
        }
        iVar4 = 0x2f47;
        if ((3 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,3), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar2 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar2 != 0)) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2f81;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((4 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,4), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar2 = amqpvalue_get_boolean(pAVar7,(_Bool *)&local_40), iVar2 != 0)) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2f9e;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((5 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,5), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) && (iVar2 = amqpvalue_get_map(pAVar7,&local_40), iVar2 != 0)
             ) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2fbb;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((6 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,6), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 != 0)) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2fd8;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((7 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,7), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) && (iVar2 = amqpvalue_get_map(pAVar7,&local_40), iVar2 != 0)
             ) {
            amqpvalue_destroy(pAVar7);
            source_destroy(*source_handle);
            return 0x2ff5;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((8 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,8), pAVar7 != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy(pAVar7);
        }
        if ((9 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,9), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if (AVar3 != AMQP_TYPE_NULL) {
            local_40 = (AMQP_VALUE)0x0;
            AVar3 = amqpvalue_get_type(pAVar7);
            if (((AVar3 == AMQP_TYPE_ARRAY) &&
                (iVar2 = amqpvalue_get_array(pAVar7,&local_38), iVar2 == 0)) ||
               (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 == 0)) {
              bVar1 = true;
            }
            else {
              amqpvalue_destroy(pAVar7);
              source_destroy(*source_handle);
              iVar4 = 0x3021;
              bVar1 = false;
            }
            if (!bVar1) {
              return iVar4;
            }
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((10 < local_44) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar6,10), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar6);
          if (AVar3 != AMQP_TYPE_NULL) {
            local_40 = (AMQP_VALUE)0x0;
            AVar3 = amqpvalue_get_type(pAVar6);
            if (((AVar3 == AMQP_TYPE_ARRAY) &&
                (iVar2 = amqpvalue_get_array(pAVar6,&local_38), iVar2 == 0)) ||
               (iVar2 = amqpvalue_get_symbol(pAVar6,(char **)&local_40), iVar2 == 0)) {
              bVar1 = true;
            }
            else {
              amqpvalue_destroy(pAVar6);
              source_destroy(*source_handle);
              iVar4 = 0x3040;
              bVar1 = false;
            }
            if (!bVar1) {
              return iVar4;
            }
          }
          amqpvalue_destroy(pAVar6);
        }
        pAVar6 = amqpvalue_clone(value);
        pSVar5->composite_value = pAVar6;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int amqpvalue_get_source(AMQP_VALUE value, SOURCE_HANDLE* source_handle)
{
    int result;
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source_create_internal();
    *source_handle = source_instance;
    if (*source_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            source_destroy(*source_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* address */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* durable */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_durability durable;
                                if (amqpvalue_get_terminus_durability(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* expiry-policy */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_expiry_policy expiry_policy;
                                if (amqpvalue_get_terminus_expiry_policy(item_value, &expiry_policy) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* timeout */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                seconds timeout;
                                if (amqpvalue_get_seconds(item_value, &timeout) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool dynamic;
                                if (amqpvalue_get_boolean(item_value, &dynamic) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic-node-properties */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                node_properties dynamic_node_properties;
                                if (amqpvalue_get_node_properties(item_value, &dynamic_node_properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* distribution-mode */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* distribution_mode;
                                if (amqpvalue_get_symbol(item_value, &distribution_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* filter */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                filter_set filter;
                                if (amqpvalue_get_filter_set(item_value, &filter) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* default-outcome */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* outcomes */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* outcomes = NULL;
                                AMQP_VALUE outcomes_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &outcomes_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &outcomes) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* capabilities */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* capabilities = NULL;
                                AMQP_VALUE capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    source_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}